

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

int Abc_ManReadStatus(char *pFileName,char *pToken)

{
  int iVar1;
  Vec_Str_t *p;
  char *pcVar2;
  char *pStr;
  Vec_Str_t *vStr;
  int Result;
  char *pToken_local;
  char *pFileName_local;
  
  vStr._4_4_ = -1;
  p = Abc_ManReadFile(pFileName);
  if (p == (Vec_Str_t *)0x0) {
    pFileName_local._4_4_ = -1;
  }
  else {
    pcVar2 = Vec_StrArray(p);
    pcVar2 = strstr(pcVar2,pToken);
    if (pcVar2 != (char *)0x0) {
      iVar1 = strncmp(pcVar2 + 8,"proved",6);
      if (iVar1 == 0) {
        vStr._4_4_ = 1;
      }
      else {
        iVar1 = strncmp(pcVar2 + 8,"failed",6);
        if (iVar1 == 0) {
          vStr._4_4_ = 0;
        }
      }
    }
    Vec_StrFree(p);
    pFileName_local._4_4_ = vStr._4_4_;
  }
  return pFileName_local._4_4_;
}

Assistant:

int Abc_ManReadStatus( char * pFileName, char * pToken )
{
    int Result = -1;
    Vec_Str_t * vStr;
    char * pStr;
    vStr = Abc_ManReadFile( pFileName );
    if ( vStr == NULL )
        return -1;
    pStr = Vec_StrArray( vStr );
    pStr = strstr( pStr, pToken );
    if ( pStr != NULL )
    {
        if ( strncmp(pStr+8, "proved", 6) == 0 )
            Result = 1; 
        else if ( strncmp(pStr+8, "failed", 6) == 0 )
            Result = 0; 
    }
    Vec_StrFree( vStr );
    return Result;
}